

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

void Fra_ClassesTest(Fra_Cla_t *p,int Id1,int Id2)

{
  uint uVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  void **ppvVar7;
  Aig_Obj_t *pAVar8;
  
  ppAVar6 = (Aig_Obj_t **)malloc(0x20);
  p->pMemClasses = ppAVar6;
  if (Id2 <= Id1) {
    __assert_fail("Id1 < Id2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x253,"void Fra_ClassesTest(Fra_Cla_t *, int, int)");
  }
  pAVar3 = p->pAig;
  pVVar4 = pAVar3->vObjs;
  if (pVVar4 == (Vec_Ptr_t *)0x0) {
    pAVar8 = (Aig_Obj_t *)0x0;
  }
  else {
    if ((Id1 < 0) || (pVVar4->nSize <= Id1)) goto LAB_005ca174;
    pAVar8 = (Aig_Obj_t *)pVVar4->pArray[(uint)Id1];
  }
  *ppAVar6 = pAVar8;
  if ((-1 < Id2) && (pVVar4 = pAVar3->vObjs, Id2 < pVVar4->nSize)) {
    pAVar5 = (Aig_Obj_t *)pVVar4->pArray[(uint)Id2];
    ppAVar6[1] = pAVar5;
    ppAVar6[2] = (Aig_Obj_t *)0x0;
    ppAVar6[3] = (Aig_Obj_t *)0x0;
    *(Aig_Obj_t **)
     (*(long *)(*(long *)((long)(pAVar5->field_5).pData + 0x30) + 8) + (long)pAVar5->Id * 8) =
         pAVar8;
    pVVar4 = p->vClasses;
    uVar1 = pVVar4->nSize;
    if (uVar1 == pVVar4->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(pVVar4->pArray,0x80);
        }
        pVVar4->pArray = ppvVar7;
        pVVar4->nCap = 0x10;
      }
      else {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar7 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
        }
        pVVar4->pArray = ppvVar7;
        pVVar4->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar7 = pVVar4->pArray;
    }
    iVar2 = pVVar4->nSize;
    pVVar4->nSize = iVar2 + 1;
    ppvVar7[iVar2] = ppAVar6;
    return;
  }
LAB_005ca174:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Fra_ClassesTest( Fra_Cla_t * p, int Id1, int Id2 )
{
    Aig_Obj_t ** pClass;
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 4 );
    pClass = p->pMemClasses;
    assert( Id1 < Id2 );
    pClass[0] = Aig_ManObj( p->pAig, Id1 );
    pClass[1] = Aig_ManObj( p->pAig, Id2 );
    pClass[2] = NULL;
    pClass[3] = NULL;
    Fra_ClassObjSetRepr( pClass[1], pClass[0] );
    Vec_PtrPush( p->vClasses, pClass );
}